

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void nite::strSplit(string *input,string *split,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *list)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  long lVar5;
  string local_b0;
  string local_90;
  int local_70;
  int k;
  string local_60;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  string *split_local;
  string *input_local;
  
  local_20 = list;
  list_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)split;
  split_local = input;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(list);
  if (sVar4 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(local_20);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)input);
  strRemoveCoin(&local_40,&local_60,(string *)list_local);
  std::__cxx11::string::operator=((string *)input,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  while( true ) {
    iVar1 = std::__cxx11::string::find((string *)input,(ulong)list_local);
    local_70 = iVar1;
    if (iVar1 == -1) break;
    iVar2 = std::__cxx11::string::length();
    this = local_20;
    if (iVar1 == iVar2 + -1) {
      lVar5 = std::__cxx11::string::length();
      std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)input,lVar5 - 1);
    }
    else if (local_70 == 0) {
      std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)input,0);
    }
    else {
      subStr(&local_90,input,0,local_70 - 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      iVar1 = local_70;
      iVar2 = std::__cxx11::string::length();
      iVar3 = std::__cxx11::string::length();
      subStr(&local_b0,input,iVar1 + iVar2,iVar3 - 1);
      std::__cxx11::string::operator=((string *)input,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  lVar5 = std::__cxx11::string::length();
  if (lVar5 != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_20,input);
  }
  return;
}

Assistant:

void nite::strSplit(String input, const String &split, Vector<String> &list){
	if ( !list.size() ){
		list.clear();
	}

	input = nite::strRemoveCoin(input, split);

	while (1){
		int k = input.find(split);

		if (k == -1){
			if (input.length()>0){
				list.push_back(input);
			}
			break;
		}

		if (k == (int)input.length()-1){
			input.erase(input.length()-1, split.length());
			continue;
		}

		if (k == 0){
			input.erase(0, split.length());
			continue;
		}

		list.push_back(subStr(input, 0,k-1));
		input = nite::subStr(input, k+split.length(), input.length()-1);
	}

	return;
}